

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::value_true(void)

{
  return_type rVar1;
  bool bVar2;
  size_type sVar3;
  int local_8c;
  value local_88;
  value_type input [1];
  reader reader;
  
  input[0] = 0x81;
  trial::protocol::bintoken::reader::reader<unsigned_char[1]>(&reader,&input);
  local_88 = reader.decoder.current.code;
  local_8c = 0x81;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x74,"void basic_suite::value_true()",&local_88,&local_8c);
  local_88 = trial::protocol::bintoken::token::symbol::convert(reader.decoder.current.code);
  local_8c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x75,"void basic_suite::value_true()",&local_88,&local_8c);
  local_88 = trial::protocol::bintoken::detail::decoder::category(&reader.decoder);
  local_8c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x76,"void basic_suite::value_true()",&local_88,&local_8c);
  sVar3 = trial::protocol::bintoken::reader::length(&reader);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x77,"void basic_suite::value_true()",sVar3 == 1);
  rVar1 = trial::protocol::bintoken::reader::
          overloader<trial::protocol::bintoken::token::boolean,_void>::convert(&reader);
  local_8c._0_1_ = 1;
  local_88._0_1_ = rVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<token::boolean>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x78,"void basic_suite::value_true()",&local_88,&local_8c);
  local_88._0_1_ = trial::protocol::bintoken::reader::overloader<bool,_void>::convert(&reader);
  local_8c._0_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x79,"void basic_suite::value_true()",&local_88,&local_8c);
  bVar2 = trial::protocol::bintoken::reader::next(&reader);
  local_88 = CONCAT31(local_88._1_3_,bVar2);
  local_8c = (uint)local_8c._1_3_ << 8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x7a,"void basic_suite::value_true()",&local_88,&local_8c);
  local_88 = reader.decoder.current.code;
  local_8c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x7b,"void basic_suite::value_true()",&local_88,&local_8c);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&reader.stack);
  return;
}

Assistant:

void value_true()
{
    const value_type input[] = { token::code::true_value };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::boolean>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}